

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall
kj::VectorOutputStream::VectorOutputStream(VectorOutputStream *this,size_t initialCapacity)

{
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__VectorOutputStream_00679418;
  heapArray<unsigned_char>(&this->vector,initialCapacity);
  this->fillPos = (this->vector).ptr;
  return;
}

Assistant:

VectorOutputStream::VectorOutputStream(size_t initialCapacity)
    : vector(heapArray<byte>(initialCapacity)), fillPos(vector.begin()) {}